

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

aiNode * __thiscall
Assimp::COBImporter::BuildNodes(COBImporter *this,Node *root,Scene *scin,aiScene *fill)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Face *pFVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __uniq_ptr_data<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>,_true,_true>
  _Var11;
  bool bVar12;
  aiNode *this_00;
  size_type sVar13;
  iterator *this_01;
  reference __p;
  aiMesh *this_02;
  aiVector3D *paVar14;
  size_type *psVar15;
  deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *this_03;
  reference ppFVar16;
  const_reference pvVar17;
  const_reference pvVar18;
  Logger *this_04;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar19;
  basic_formatter *pbVar20;
  aiMaterial *this_05;
  aiLight *this_06;
  aiColor3D *paVar21;
  aiCamera *this_07;
  ulong uVar22;
  uint *puVar23;
  aiNode **__s;
  reference ppNVar24;
  aiNode *paVar25;
  aiLightSourceType aVar26;
  aiFace *paVar27;
  ulong uVar28;
  aiFace *local_ad8;
  aiVector3t<float> *local_aa0;
  aiVector3t<float> *local_a78;
  Node *n_1;
  iterator __end1;
  iterator __begin1;
  ChildList *__range1;
  uint i;
  aiCamera *outcam;
  Camera *ndcam;
  aiLight *outlight;
  Light *ndlight;
  shared_ptr<Assimp::COB::Texture> local_9c0;
  shared_ptr<Assimp::COB::Texture> local_9b0;
  aiColor3D local_9a0;
  aiColor3D local_994;
  aiColor3D local_988;
  undefined1 local_97c [8];
  aiColor3D c;
  int shader;
  int tmp;
  string local_7f0;
  undefined1 local_7cc [8];
  aiString s;
  aiMaterial *mat;
  string local_248;
  unique_ptr<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
  local_228;
  unique_ptr<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_> defmat;
  Material *m;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  MaterialList *__range4_2;
  Material *min;
  float local_1f0;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  reference local_1a0;
  VertexIndex *v;
  iterator __end5;
  iterator __begin5;
  vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *__range5;
  aiFace *fout;
  Face *f_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *__range4_1;
  aiMesh *outmesh;
  Face *f;
  const_iterator __end4;
  const_iterator __begin4;
  deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *__range4;
  size_t n;
  deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> dStack_b8;
  size_t *local_68;
  Entry *reflist;
  const_iterator __end3;
  const_iterator __begin3;
  TempMap *__range3;
  Mesh *ndmesh;
  aiNode *nd;
  aiScene *fill_local;
  Scene *scin_local;
  Node *root_local;
  COBImporter *this_local;
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  aiString::Set((aiString *)this_00,&root->name);
  memcpy(&this_00->mTransformation,&root->transform,0x40);
  if (root->type == TYPE_MESH) {
    sVar13 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &root[1].type);
    if ((sVar13 != 0) &&
       (sVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                           ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                            (root + 1)), sVar13 != 0)) {
      this_01 = &root[1].temp_children.
                 super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish;
      __end3 = std::
               map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
               ::begin((map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                        *)this_01);
      reflist = (Entry *)std::
                         map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                         ::end((map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                                *)this_01);
      while (bVar12 = std::operator!=(&__end3,(_Self *)&reflist), bVar12) {
        __p = std::
              _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>
              ::operator*(&__end3);
        std::
        pair<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>::
        pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_true>
                  ((pair<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>
                    *)&n,__p);
        local_68 = &n;
        __range4 = (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)0x0;
        std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::begin
                  ((const_iterator *)&__end4._M_node,&dStack_b8);
        std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::end
                  ((const_iterator *)&f,&dStack_b8);
        while (bVar12 = std::operator!=((_Self *)&__end4._M_node,(_Self *)&f), bVar12) {
          ppFVar16 = std::
                     _Deque_iterator<Assimp::COB::Face_*,_Assimp::COB::Face_*const_&,_Assimp::COB::Face_*const_*>
                     ::operator*((_Deque_iterator<Assimp::COB::Face_*,_Assimp::COB::Face_*const_&,_Assimp::COB::Face_*const_*>
                                  *)&__end4._M_node);
          sVar13 = std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                   ::size(&(*ppFVar16)->indices);
          __range4 = (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)
                     ((long)&(__range4->
                             super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>
                             )._M_impl.super__Deque_impl_data._M_map + sVar13);
          std::
          _Deque_iterator<Assimp::COB::Face_*,_Assimp::COB::Face_*const_&,_Assimp::COB::Face_*const_*>
          ::operator++((_Deque_iterator<Assimp::COB::Face_*,_Assimp::COB::Face_*const_&,_Assimp::COB::Face_*const_*>
                        *)&__end4._M_node);
        }
        if (__range4 != (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)0x0) {
          this_02 = (aiMesh *)operator_new(0x520);
          aiMesh::aiMesh(this_02);
          uVar4 = fill->mNumMeshes;
          fill->mNumMeshes = uVar4 + 1;
          fill->mMeshes[uVar4] = this_02;
          this_00->mNumMeshes = this_00->mNumMeshes + 1;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = __range4;
          uVar22 = SUB168(auVar10 * ZEXT816(0xc),0);
          if (SUB168(auVar10 * ZEXT816(0xc),8) != 0) {
            uVar22 = 0xffffffffffffffff;
          }
          paVar14 = (aiVector3D *)operator_new__(uVar22);
          if (__range4 != (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)0x0) {
            local_a78 = paVar14;
            do {
              aiVector3t<float>::aiVector3t(local_a78);
              local_a78 = local_a78 + 1;
            } while (local_a78 != paVar14 + (long)__range4);
          }
          this_02->mVertices = paVar14;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = __range4;
          uVar22 = SUB168(auVar6 * ZEXT816(0xc),0);
          if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
            uVar22 = 0xffffffffffffffff;
          }
          paVar14 = (aiVector3D *)operator_new__(uVar22);
          if (__range4 != (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)0x0) {
            local_aa0 = paVar14;
            do {
              aiVector3t<float>::aiVector3t(local_aa0);
              local_aa0 = local_aa0 + 1;
            } while (local_aa0 != paVar14 + (long)__range4);
          }
          this_02->mTextureCoords[0] = paVar14;
          sVar13 = std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::size
                             ((deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)
                              (local_68 + 1));
          auVar7._8_8_ = 0;
          auVar7._0_8_ = sVar13;
          uVar22 = SUB168(auVar7 * ZEXT816(0x10),0);
          uVar28 = uVar22 + 8;
          if (0xfffffffffffffff7 < uVar22) {
            uVar28 = 0xffffffffffffffff;
          }
          if (SUB168(auVar7 * ZEXT816(0x10),8) != 0) {
            uVar28 = 0xffffffffffffffff;
          }
          psVar15 = (size_type *)operator_new__(uVar28);
          *psVar15 = sVar13;
          paVar27 = (aiFace *)(psVar15 + 1);
          if (sVar13 != 0) {
            local_ad8 = paVar27;
            do {
              aiFace::aiFace(local_ad8);
              local_ad8 = local_ad8 + 1;
            } while (local_ad8 != paVar27 + sVar13);
          }
          this_02->mFaces = paVar27;
          this_03 = (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)
                    (local_68 + 1);
          std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::begin
                    ((const_iterator *)&__end4_1._M_node,this_03);
          std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::end
                    ((const_iterator *)&f_1,this_03);
          while (bVar12 = std::operator!=((_Self *)&__end4_1._M_node,(_Self *)&f_1), bVar12) {
            ppFVar16 = std::
                       _Deque_iterator<Assimp::COB::Face_*,_Assimp::COB::Face_*const_&,_Assimp::COB::Face_*const_*>
                       ::operator*((_Deque_iterator<Assimp::COB::Face_*,_Assimp::COB::Face_*const_&,_Assimp::COB::Face_*const_*>
                                    *)&__end4_1._M_node);
            pFVar5 = *ppFVar16;
            bVar12 = std::
                     vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
                     empty(&pFVar5->indices);
            if (!bVar12) {
              uVar4 = this_02->mNumFaces;
              this_02->mNumFaces = uVar4 + 1;
              paVar27 = this_02->mFaces + uVar4;
              sVar13 = std::
                       vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
                       size(&pFVar5->indices);
              auVar8._8_8_ = 0;
              auVar8._0_8_ = sVar13;
              uVar22 = SUB168(auVar8 * ZEXT816(4),0);
              if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
                uVar22 = 0xffffffffffffffff;
              }
              puVar23 = (uint *)operator_new__(uVar22);
              paVar27->mIndices = puVar23;
              __end5 = std::
                       vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
                       begin(&pFVar5->indices);
              v = (VertexIndex *)
                  std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
                  end(&pFVar5->indices);
              while (bVar12 = __gnu_cxx::operator!=
                                        (&__end5,(__normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>
                                                  *)&v), bVar12) {
                local_1a0 = __gnu_cxx::
                            __normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>
                            ::operator*(&__end5);
                uVar4 = local_1a0->pos_idx;
                sVar13 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     *)&root[1].type);
                if (sVar13 <= uVar4) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_1c0,"Position index out of range",&local_1c1);
                  ThrowException(&local_1c0);
                }
                uVar4 = local_1a0->uv_idx;
                sVar13 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                                   ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                     *)(root + 1));
                if (sVar13 <= uVar4) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_1e8,"UV index out of range",&local_1e9);
                  ThrowException(&local_1e8);
                }
                pvVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)&root[1].type,(ulong)local_1a0->pos_idx);
                paVar14 = this_02->mVertices;
                uVar4 = this_02->mNumVertices;
                paVar14[uVar4].z = pvVar17->z;
                fVar1 = pvVar17->y;
                paVar14 = paVar14 + uVar4;
                paVar14->x = pvVar17->x;
                paVar14->y = fVar1;
                pvVar18 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::
                          operator[]((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                      *)(root + 1),(ulong)local_1a0->uv_idx);
                fVar1 = pvVar18->x;
                pvVar18 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::
                          operator[]((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                      *)(root + 1),(ulong)local_1a0->uv_idx);
                aiVector3t<float>::aiVector3t((aiVector3t<float> *)&min,fVar1,pvVar18->y,0.0);
                paVar14 = this_02->mTextureCoords[0];
                uVar4 = this_02->mNumVertices;
                *(Material **)(paVar14 + uVar4) = min;
                paVar14[uVar4].z = local_1f0;
                uVar4 = this_02->mNumVertices;
                this_02->mNumVertices = uVar4 + 1;
                uVar2 = paVar27->mNumIndices;
                paVar27->mNumIndices = uVar2 + 1;
                paVar27->mIndices[uVar2] = uVar4;
                __gnu_cxx::
                __normal_iterator<Assimp::COB::VertexIndex_*,_std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>_>
                ::operator++(&__end5);
              }
            }
            std::
            _Deque_iterator<Assimp::COB::Face_*,_Assimp::COB::Face_*const_&,_Assimp::COB::Face_*const_*>
            ::operator++((_Deque_iterator<Assimp::COB::Face_*,_Assimp::COB::Face_*const_&,_Assimp::COB::Face_*const_*>
                          *)&__end4_1._M_node);
          }
          this_02->mMaterialIndex = fill->mNumMaterials;
          __range4_2 = (MaterialList *)0x0;
          __end4_2 = std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::
                     begin(&scin->materials);
          m = (Material *)
              std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::end
                        (&scin->materials);
          while ((bVar12 = __gnu_cxx::operator!=
                                     (&__end4_2,
                                      (__normal_iterator<const_Assimp::COB::Material_*,_std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>_>
                                       *)&m),
                 _Var11.
                 super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
                 .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>._M_head_impl =
                      (__uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                       )(__uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                         )__range4_2, bVar12 &&
                 ((defmat._M_t.
                   super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
                   .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>._M_head_impl =
                        (__uniq_ptr_data<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>,_true,_true>
                         )__gnu_cxx::
                          __normal_iterator<const_Assimp::COB::Material_*,_std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>_>
                          ::operator*(&__end4_2),
                  *(uint *)((long)defmat._M_t.
                                  super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
                                  .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>.
                                  _M_head_impl + 4) != (root->super_ChunkInfo).id ||
                  (_Var11.
                   super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
                   .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>._M_head_impl =
                        (__uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                         )(tuple<const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
                           )(__uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                             )defmat._M_t.
                              super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
                              .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>.
                              _M_head_impl,
                  *(uint *)((long)defmat._M_t.
                                  super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
                                  .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>.
                                  _M_head_impl + 0x50) != (uint)*local_68))))) {
            __gnu_cxx::
            __normal_iterator<const_Assimp::COB::Material_*,_std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>_>
            ::operator++(&__end4_2);
          }
          __range4_2 = (MaterialList *)
                       _Var11.
                       super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
                       .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>._M_head_impl;
          std::
          unique_ptr<Assimp::COB::Material_const,std::default_delete<Assimp::COB::Material_const>>::
          unique_ptr<std::default_delete<Assimp::COB::Material_const>,void>
                    ((unique_ptr<Assimp::COB::Material_const,std::default_delete<Assimp::COB::Material_const>>
                      *)&local_228);
          if (__range4_2 == (MaterialList *)0x0) {
            this_04 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &mat);
            pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)&mat,(char (*) [34])"Could not resolve material index ");
            pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator<<(pbVar19,(uint *)local_68);
            pbVar20 = (basic_formatter *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator<<(pbVar19,(char (*) [43])" - creating default material for this slot"
                                );
            Formatter::basic_formatter::operator_cast_to_string(&local_248,pbVar20);
            Logger::debug(this_04,&local_248);
            std::__cxx11::string::~string((string *)&local_248);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *
                             )&mat);
            __range4_2 = (MaterialList *)operator_new(0x90);
            COB::Material::Material((Material *)__range4_2);
            std::
            unique_ptr<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
            ::reset(&local_228,(pointer)__range4_2);
          }
          this_05 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_05);
          uVar4 = fill->mNumMaterials;
          fill->mNumMaterials = uVar4 + 1;
          fill->mMaterials[uVar4] = this_05;
          s.data._1016_8_ = this_05;
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[6]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&shader
                     ,(char (*) [6])"#mat_");
          pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &shader,&fill->mNumMeshes);
          pbVar19 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<(pbVar19,(char (*) [2])0xc65132);
          pbVar20 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<(pbVar19,(uint *)&__range4_2[3].
                                                super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                                                ._M_impl.super__Vector_impl_data._M_finish);
          Formatter::basic_formatter::operator_cast_to_string(&local_7f0,pbVar20);
          aiString::aiString((aiString *)local_7cc,&local_7f0);
          std::__cxx11::string::~string((string *)&local_7f0);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &shader);
          aiMaterial::AddProperty
                    ((aiMaterial *)s.data._1016_8_,(aiString *)local_7cc,"?mat.name",0,0);
          c.b = (ai_real)(uint)(((ulong)root[1].temp_children.
                                        super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_node & 4) != 0);
          if (c.b != 0.0) {
            aiMaterial::AddProperty
                      ((aiMaterial *)s.data._1016_8_,(int *)&c.b,1,"$mat.wireframe",0,0);
          }
          iVar3 = *(int *)((long)&__range4_2[3].
                                  super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          if (iVar3 == 0) {
            c.g = 2.8026e-45;
          }
          else if (iVar3 == 1) {
            c.g = 4.2039e-45;
          }
          else {
            if (iVar3 != 2) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/COB/COBLoader.cpp"
                            ,0x152,
                            "aiNode *Assimp::COBImporter::BuildNodes(const Node &, const Scene &, aiScene *)"
                           );
            }
            c.g = 1.12104e-44;
          }
          aiMaterial::AddProperty((aiMaterial *)s.data._1016_8_,(int *)&c.g,1,"$mat.shadingm",0,0);
          if (c.g != 2.8026e-45) {
            aiMaterial::AddProperty
                      ((aiMaterial *)s.data._1016_8_,
                       (float *)&__range4_2[2].
                                 super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,1,
                       "$mat.shininess",0,0);
          }
          aiMaterial::AddProperty
                    ((aiMaterial *)s.data._1016_8_,
                     (float *)((long)&__range4_2[2].
                                      super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1,
                     "$mat.refracti",0,0);
          aiMaterial::AddProperty
                    ((aiMaterial *)s.data._1016_8_,(aiColor3D *)(__range4_2 + 2),1,"$clr.diffuse",0,
                     0);
          aiColor3D::aiColor3D(&local_988,(aiColor3D *)(__range4_2 + 2));
          aiColor3D::operator*
                    ((aiColor3D *)local_97c,
                     *(ai_real *)
                      ((long)&__range4_2[3].
                              super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4));
          aiMaterial::AddProperty
                    ((aiMaterial *)s.data._1016_8_,(aiColor3D *)local_97c,1,"$clr.specular",0,0);
          aiColor3D::aiColor3D(&local_9a0,(aiColor3D *)(__range4_2 + 2));
          aiColor3D::operator*
                    (&local_994,
                     *(ai_real *)
                      &__range4_2[3].
                       super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          aiColor3D::operator=((aiColor3D *)local_97c,&local_994);
          aiMaterial::AddProperty
                    ((aiMaterial *)s.data._1016_8_,(aiColor3D *)local_97c,1,"$clr.ambient",0,0);
          bVar12 = std::__shared_ptr::operator_cast_to_bool
                             ((__shared_ptr *)
                              &__range4_2[5].
                               super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          if (bVar12) {
            std::shared_ptr<Assimp::COB::Texture>::shared_ptr
                      (&local_9b0,
                       (shared_ptr<Assimp::COB::Texture> *)
                       &__range4_2[5].
                        super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            ConvertTexture(&local_9b0,(aiMaterial *)s.data._1016_8_,aiTextureType_DIFFUSE);
            std::shared_ptr<Assimp::COB::Texture>::~shared_ptr(&local_9b0);
          }
          bVar12 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(__range4_2 + 4));
          if (bVar12) {
            std::shared_ptr<Assimp::COB::Texture>::shared_ptr
                      (&local_9c0,(shared_ptr<Assimp::COB::Texture> *)(__range4_2 + 4));
            ConvertTexture(&local_9c0,(aiMaterial *)s.data._1016_8_,aiTextureType_UNKNOWN);
            std::shared_ptr<Assimp::COB::Texture>::~shared_ptr(&local_9c0);
          }
          bVar12 = std::__shared_ptr::operator_cast_to_bool
                             ((__shared_ptr *)
                              &__range4_2[4].
                               super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar12) {
            std::shared_ptr<Assimp::COB::Texture>::shared_ptr
                      ((shared_ptr<Assimp::COB::Texture> *)&ndlight,
                       (shared_ptr<Assimp::COB::Texture> *)
                       &__range4_2[4].
                        super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ConvertTexture((shared_ptr<Assimp::COB::Texture> *)&ndlight,
                           (aiMaterial *)s.data._1016_8_,aiTextureType_HEIGHT);
            std::shared_ptr<Assimp::COB::Texture>::~shared_ptr
                      ((shared_ptr<Assimp::COB::Texture> *)&ndlight);
          }
          std::
          unique_ptr<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
          ::~unique_ptr(&local_228);
        }
        std::
        pair<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>::
        ~pair((pair<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>
               *)&n);
        std::
        _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>
        ::operator++(&__end3);
      }
    }
  }
  else if (root->type == TYPE_LIGHT) {
    this_06 = (aiLight *)operator_new(0x46c);
    aiLight::aiLight(this_06);
    uVar4 = fill->mNumLights;
    fill->mNumLights = uVar4 + 1;
    fill->mLights[uVar4] = this_06;
    aiString::Set((aiString *)this_06,&root->name);
    paVar21 = aiColor3D::operator=(&this_06->mColorSpecular,(aiColor3D *)&root->field_0xd4);
    paVar21 = aiColor3D::operator=(&this_06->mColorAmbient,paVar21);
    aiColor3D::operator=(&this_06->mColorDiffuse,paVar21);
    this_06->mAngleOuterCone = (float)root[1].super_ChunkInfo.id * 0.017453292;
    this_06->mAngleInnerCone = (float)root[1].super_ChunkInfo.parent_id * 0.017453292;
    aVar26 = aiLightSource_DIRECTIONAL;
    if (root[1].super_ChunkInfo.version == 0) {
      aVar26 = aiLightSource_SPOT;
    }
    this_06->mType = aVar26;
  }
  else if (root->type == TYPE_CAMERA) {
    this_07 = (aiCamera *)operator_new(0x438);
    aiCamera::aiCamera(this_07);
    uVar4 = fill->mNumCameras;
    fill->mNumCameras = uVar4 + 1;
    fill->mCameras[uVar4] = this_07;
    aiString::Set((aiString *)this_07,&root->name);
  }
  if (this_00->mNumMeshes != 0) {
    auVar10 = ZEXT416(this_00->mNumMeshes) * ZEXT816(4);
    uVar22 = auVar10._0_8_;
    if (auVar10._8_8_ != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    puVar23 = (uint *)operator_new__(uVar22);
    this_00->mMeshes = puVar23;
    for (__range1._4_4_ = 0; __range1._4_4_ < this_00->mNumMeshes;
        __range1._4_4_ = __range1._4_4_ + 1) {
      this_00->mMeshes[__range1._4_4_] = (fill->mNumMeshes - __range1._4_4_) - 1;
    }
  }
  sVar13 = std::deque<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::size
                     (&root->temp_children);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = sVar13;
  uVar22 = SUB168(auVar9 * ZEXT816(8),0);
  if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
    uVar22 = 0xffffffffffffffff;
  }
  __s = (aiNode **)operator_new__(uVar22);
  memset(__s,0,uVar22);
  this_00->mChildren = __s;
  std::deque<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::begin
            ((iterator *)&__end1._M_node,&root->temp_children);
  std::deque<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::end
            ((iterator *)&n_1,&root->temp_children);
  while (bVar12 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&n_1), bVar12) {
    ppNVar24 = std::
               _Deque_iterator<const_Assimp::COB::Node_*,_const_Assimp::COB::Node_*&,_const_Assimp::COB::Node_**>
               ::operator*((_Deque_iterator<const_Assimp::COB::Node_*,_const_Assimp::COB::Node_*&,_const_Assimp::COB::Node_**>
                            *)&__end1._M_node);
    paVar25 = BuildNodes(this,*ppNVar24,scin,fill);
    uVar4 = this_00->mNumChildren;
    this_00->mNumChildren = uVar4 + 1;
    this_00->mChildren[uVar4] = paVar25;
    paVar25->mParent = this_00;
    std::
    _Deque_iterator<const_Assimp::COB::Node_*,_const_Assimp::COB::Node_*&,_const_Assimp::COB::Node_**>
    ::operator++((_Deque_iterator<const_Assimp::COB::Node_*,_const_Assimp::COB::Node_*&,_const_Assimp::COB::Node_**>
                  *)&__end1._M_node);
  }
  return this_00;
}

Assistant:

aiNode* COBImporter::BuildNodes(const Node& root,const Scene& scin,aiScene* fill)
{
    aiNode* nd = new aiNode();
    nd->mName.Set(root.name);
    nd->mTransformation = root.transform;

    // Note to everybody believing Voodoo is appropriate here:
    // I know polymorphism, run as fast as you can ;-)
    if (Node::TYPE_MESH == root.type) {
        const Mesh& ndmesh = (const Mesh&)(root);
        if (ndmesh.vertex_positions.size() && ndmesh.texture_coords.size()) {

            typedef std::pair<unsigned int,Mesh::FaceRefList> Entry;
            for(const Entry& reflist : ndmesh.temp_map) {
                {   // create mesh
                    size_t n = 0;
                    for(Face* f : reflist.second) {
                        n += f->indices.size();
                    }
                    if (!n) {
                        continue;
                    }
                    aiMesh* outmesh = fill->mMeshes[fill->mNumMeshes++] = new aiMesh();
                    ++nd->mNumMeshes;

                    outmesh->mVertices = new aiVector3D[n];
                    outmesh->mTextureCoords[0] = new aiVector3D[n];

                    outmesh->mFaces = new aiFace[reflist.second.size()]();
                    for(Face* f : reflist.second) {
                        if (f->indices.empty()) {
                            continue;
                        }

                        aiFace& fout = outmesh->mFaces[outmesh->mNumFaces++];
                        fout.mIndices = new unsigned int[f->indices.size()];

                        for(VertexIndex& v : f->indices) {
                            if (v.pos_idx >= ndmesh.vertex_positions.size()) {
                                ThrowException("Position index out of range");
                            }
                            if (v.uv_idx >= ndmesh.texture_coords.size()) {
                                ThrowException("UV index out of range");
                            }
                            outmesh->mVertices[outmesh->mNumVertices] = ndmesh.vertex_positions[ v.pos_idx ];
                            outmesh->mTextureCoords[0][outmesh->mNumVertices] = aiVector3D(
                                ndmesh.texture_coords[ v.uv_idx ].x,
                                ndmesh.texture_coords[ v.uv_idx ].y,
                                0.f
                            );

                            fout.mIndices[fout.mNumIndices++] = outmesh->mNumVertices++;
                        }
                    }
                    outmesh->mMaterialIndex = fill->mNumMaterials;
                }{  // create material
                    const Material* min = NULL;
                    for(const Material& m : scin.materials) {
                        if (m.parent_id == ndmesh.id && m.matnum == reflist.first) {
                            min = &m;
                            break;
                        }
                    }
                    std::unique_ptr<const Material> defmat;
                    if(!min) {
                        ASSIMP_LOG_DEBUG(format()<<"Could not resolve material index "
                            <<reflist.first<<" - creating default material for this slot");

                        defmat.reset(min=new Material());
                    }

                    aiMaterial* mat = new aiMaterial();
                    fill->mMaterials[fill->mNumMaterials++] = mat;

                    const aiString s(format("#mat_")<<fill->mNumMeshes<<"_"<<min->matnum);
                    mat->AddProperty(&s,AI_MATKEY_NAME);

                    if(int tmp = ndmesh.draw_flags & Mesh::WIRED ? 1 : 0) {
                        mat->AddProperty(&tmp,1,AI_MATKEY_ENABLE_WIREFRAME);
                    }

                    {   int shader;
                        switch(min->shader)
                        {
                        case Material::FLAT:
                            shader = aiShadingMode_Gouraud;
                            break;

                        case Material::PHONG:
                            shader = aiShadingMode_Phong;
                            break;

                        case Material::METAL:
                            shader = aiShadingMode_CookTorrance;
                            break;

                        default:
                            ai_assert(false); // shouldn't be here
                        }
                        mat->AddProperty(&shader,1,AI_MATKEY_SHADING_MODEL);
                        if(shader != aiShadingMode_Gouraud) {
                            mat->AddProperty(&min->exp,1,AI_MATKEY_SHININESS);
                        }
                    }

                    mat->AddProperty(&min->ior,1,AI_MATKEY_REFRACTI);
                    mat->AddProperty(&min->rgb,1,AI_MATKEY_COLOR_DIFFUSE);

                    aiColor3D c = aiColor3D(min->rgb)*min->ks;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);

                    c = aiColor3D(min->rgb)*min->ka;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);

                    // convert textures if some exist.
                    if(min->tex_color) {
                        ConvertTexture(min->tex_color,mat,aiTextureType_DIFFUSE);
                    }
                    if(min->tex_env) {
                        ConvertTexture(min->tex_env  ,mat,aiTextureType_UNKNOWN);
                    }
                    if(min->tex_bump) {
                        ConvertTexture(min->tex_bump ,mat,aiTextureType_HEIGHT);
                    }
                }
            }
        }
    }
    else if (Node::TYPE_LIGHT == root.type) {
        const Light& ndlight = (const Light&)(root);
        aiLight* outlight = fill->mLights[fill->mNumLights++] = new aiLight();

        outlight->mName.Set(ndlight.name);
        outlight->mColorDiffuse = outlight->mColorAmbient = outlight->mColorSpecular = ndlight.color;

        outlight->mAngleOuterCone = AI_DEG_TO_RAD(ndlight.angle);
        outlight->mAngleInnerCone = AI_DEG_TO_RAD(ndlight.inner_angle);

        // XXX
        outlight->mType = ndlight.ltype==Light::SPOT ? aiLightSource_SPOT : aiLightSource_DIRECTIONAL;
    }
    else if (Node::TYPE_CAMERA == root.type) {
        const Camera& ndcam = (const Camera&)(root);
        aiCamera* outcam = fill->mCameras[fill->mNumCameras++] = new aiCamera();

        outcam->mName.Set(ndcam.name);
    }

    // add meshes
    if (nd->mNumMeshes) { // mMeshes must be NULL if count is 0
        nd->mMeshes = new unsigned int[nd->mNumMeshes];
        for(unsigned int i = 0; i < nd->mNumMeshes;++i) {
            nd->mMeshes[i] = fill->mNumMeshes-i-1;
        }
    }

    // add children recursively
    nd->mChildren = new aiNode*[root.temp_children.size()]();
    for(const Node* n : root.temp_children) {
        (nd->mChildren[nd->mNumChildren++] = BuildNodes(*n,scin,fill))->mParent = nd;
    }

    return nd;
}